

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void display_array(int *p,int size,int nl,FILE *fp)

{
  uint uVar1;
  int local_24;
  int i;
  FILE *fp_local;
  int nl_local;
  int size_local;
  int *p_local;
  
  _nl_local = (uint *)p;
  for (local_24 = 1; local_24 <= size; local_24 = local_24 + 1) {
    uVar1 = *_nl_local;
    if (uVar1 == 0xff676980) {
      fprintf((FILE *)fp,"  -INf");
    }
    else if (uVar1 == 0xffffffce) {
      fprintf((FILE *)fp,"   DEF");
    }
    else if (uVar1 == 10000000) {
      fprintf((FILE *)fp,"   INF");
    }
    else {
      fprintf((FILE *)fp,"%6d",(ulong)*_nl_local);
    }
    if (local_24 % nl == 0) {
      fprintf((FILE *)fp,"\n");
    }
    _nl_local = _nl_local + 1;
  }
  if (size % nl != 0) {
    fprintf((FILE *)fp,"\n");
  }
  return;
}

Assistant:

PRIVATE void
display_array(int   *p,
              int   size,
              int   nl,
              FILE  *fp)
{
  int i;

  for (i = 1; i <= size; i++, p++) {
    switch (*p) {
      case  INF:
        fprintf(fp, "   INF");
        break;
      case -INF:
        fprintf(fp, "  -INf");
        break;
      case  DEF:
        fprintf(fp, "   DEF");
        break;
      default:
        fprintf(fp, "%6d", *p);
        break;
    }
    if ((i % nl) == 0)
      fprintf(fp, "\n");
  }
  if (size % nl)
    fprintf(fp, "\n");

  return;
}